

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O2

value_type __thiscall Chromosome::del_gene(Chromosome *this,size_t chromno)

{
  const_iterator __position;
  _Base_bitset<1UL> _Var1;
  
  __position._M_current =
       (this->genes).super__Vector_base<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>.
       _M_impl.super__Vector_impl_data._M_start + chromno;
  _Var1._M_w = ((__position._M_current)->super__Base_bitset<1UL>)._M_w;
  std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>::erase
            (&this->genes,__position);
  return (value_type)(_Base_bitset<1UL>)_Var1._M_w;
}

Assistant:

Chromosome::genes_t::value_type Chromosome::del_gene( size_t chromno )
{
	genes_t::value_type ret = genes[chromno];
	genes.erase(genes.begin() + chromno);

	return ret;
}